

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initialalignment.cpp
# Opt level: O0

bool __thiscall Alignment::StaticAlignmentMean(Alignment *this)

{
  ostream *this_00;
  XprTypeNested this_01;
  TransposeReturnType this_02;
  DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *in_RDI;
  MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *this_03;
  double dVar1;
  Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_0>
  PVar2;
  exception *e;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  temp;
  int i;
  Matrix3d Cnb;
  Matrix3d observation;
  Matrix3d reference;
  Vector3d vb;
  Vector3d vn;
  Vector3d Omega_n;
  Vector3d gn;
  DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *in_stack_fffffffffffffb58;
  XprTypeNested in_stack_fffffffffffffb60;
  MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *in_stack_fffffffffffffb68;
  Scalar *in_stack_fffffffffffffb78;
  Scalar *in_stack_fffffffffffffb80;
  Scalar *in_stack_fffffffffffffb88;
  Matrix<double,_3,_1,_0,_3,_1> *in_stack_fffffffffffffb90;
  double deg;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>_>
  *this_04;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffbf0;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffbf8;
  undefined4 in_stack_fffffffffffffc18;
  undefined4 in_stack_fffffffffffffc1c;
  int local_304;
  DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffda8;
  ostream *in_stack_fffffffffffffdb0;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>_>
  local_120 [176];
  double local_70;
  undefined8 local_68;
  double local_60;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  
  CalculateMean((Alignment *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
  this_00 = Eigen::operator<<(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  local_30 = 0;
  local_38 = 0;
  local_40 = 0xc0239655051512b7;
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            (in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,in_stack_fffffffffffffb80,
             in_stack_fffffffffffffb78);
  deg = 30.5278;
  dVar1 = Deg2Rad(30.5278);
  local_60 = cos(dVar1);
  local_60 = local_60 * 7.292115e-05;
  local_68 = 0;
  dVar1 = Deg2Rad(deg);
  local_70 = sin(dVar1);
  local_70 = local_70 * -7.292115e-05;
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            (in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,in_stack_fffffffffffffb80,
             in_stack_fffffffffffffb78);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
            (in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
            ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)(in_RDI + 0x48),
             in_stack_fffffffffffffbf0);
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix((Matrix<double,_3,_3,_0,_3,_3> *)0x1b5e2b);
  this_04 = local_120;
  Eigen::DenseBase<Eigen::Matrix<double,3,3,0,3,3>>::block<int,int>
            (in_RDI,(Index)deg,(Index)in_stack_fffffffffffffb90,
             (int)((ulong)in_stack_fffffffffffffb88 >> 0x20),(int)in_stack_fffffffffffffb88);
  Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false> *)
             in_stack_fffffffffffffb60.m_matrix,
             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffffb58);
  Eigen::DenseBase<Eigen::Matrix<double,3,3,0,3,3>>::block<int,int>
            (in_RDI,(Index)deg,(Index)in_stack_fffffffffffffb90,
             (int)((ulong)in_stack_fffffffffffffb88 >> 0x20),(int)in_stack_fffffffffffffb88);
  Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false> *)
             in_stack_fffffffffffffb60.m_matrix,
             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffffb58);
  Eigen::DenseBase<Eigen::Matrix<double,3,3,0,3,3>>::block<int,int>
            (in_RDI,(Index)deg,(Index)in_stack_fffffffffffffb90,
             (int)((ulong)in_stack_fffffffffffffb88 >> 0x20),(int)in_stack_fffffffffffffb88);
  Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false> *)
             in_stack_fffffffffffffb60.m_matrix,
             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffffb58);
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix((Matrix<double,_3,_3,_0,_3,_3> *)0x1b5f30);
  Eigen::DenseBase<Eigen::Matrix<double,3,3,0,3,3>>::block<int,int>
            (in_RDI,(Index)deg,(Index)in_stack_fffffffffffffb90,
             (int)((ulong)in_stack_fffffffffffffb88 >> 0x20),(int)in_stack_fffffffffffffb88);
  Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false> *)
             in_stack_fffffffffffffb60.m_matrix,
             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffffb58);
  Eigen::DenseBase<Eigen::Matrix<double,3,3,0,3,3>>::block<int,int>
            (in_RDI,(Index)deg,(Index)in_stack_fffffffffffffb90,
             (int)((ulong)in_stack_fffffffffffffb88 >> 0x20),(int)in_stack_fffffffffffffb88);
  Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false> *)
             in_stack_fffffffffffffb60.m_matrix,
             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffffb58);
  Eigen::DenseBase<Eigen::Matrix<double,3,3,0,3,3>>::block<int,int>
            (in_RDI,(Index)deg,(Index)in_stack_fffffffffffffb90,
             (int)((ulong)in_stack_fffffffffffffb88 >> 0x20),(int)in_stack_fffffffffffffb88);
  Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false> *)
             in_stack_fffffffffffffb60.m_matrix,
             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffffb58);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose(in_stack_fffffffffffffb58);
  this_01.m_matrix =
       (non_const_type)
       Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>::inverse
                 (in_stack_fffffffffffffb68);
  this_02 = Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose
                      (in_stack_fffffffffffffb58);
  PVar2 = Eigen::MatrixBase<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>>>::
          operator*((MatrixBase<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
                     *)in_stack_fffffffffffffb60.m_matrix,
                    (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *)
                    in_stack_fffffffffffffb58);
  Eigen::Matrix<double,3,3,0,3,3>::
  Matrix<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,0>>
            (in_stack_fffffffffffffb60.m_matrix,
             (EigenBase<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_0>_>
              *)in_stack_fffffffffffffb58);
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::operator=
            (in_stack_fffffffffffffb60.m_matrix,
             (Matrix<double,_3,_3,_0,_3,_3> *)in_stack_fffffffffffffb58);
  for (local_304 = 0; local_304 < 0x1e; local_304 = local_304 + 1) {
    this_03 = (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *)
              (in_RDI + 0x60);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose(in_stack_fffffffffffffb58);
    in_stack_fffffffffffffb60.m_matrix =
         (non_const_type)
         Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>::inverse
                   (this_03);
    Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator+
              ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_02.m_matrix,
               (MatrixBase<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
                *)PVar2.m_lhs.m_xpr.m_matrix.m_xpr);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>>const>>
    ::operator*(this_04,(double *)in_RDI);
    Eigen::Matrix<double,3,3,0,3,3>::operator=
              (in_stack_fffffffffffffb60.m_matrix,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
                *)in_stack_fffffffffffffb58);
  }
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix
            (in_stack_fffffffffffffb60.m_matrix,
             (Matrix<double,_3,_3,_0,_3,_3> *)in_stack_fffffffffffffb58);
  CalculateEuler((Alignment *)this_01.m_matrix,this_02.m_matrix,
                 (double *)PVar2.m_lhs.m_xpr.m_matrix.m_xpr);
  return true;
}

Assistant:

bool Alignment::StaticAlignmentMean()
{
    this->CalculateMean();
    cout << this->Mean[0] << endl;
    Vector3d gn(0, 0, -GRAVITY);
    Vector3d Omega_n(OMEGA * cos(Deg2Rad(PHI)), 0, -OMEGA * sin(Deg2Rad(PHI)));
    Vector3d vn = gn.cross(Omega_n);
    Vector3d vb = this->Mean[0].cross(this->Mean[1]);

    Matrix3d reference;
    reference.block(0, 0, 3, 1) = gn;
    reference.block(0, 1, 3, 1) = Omega_n;
    reference.block(0, 2, 3, 1) = vn;
    
    Matrix3d observation;
    observation.block(0, 0, 3, 1) = this->Mean[0];
    observation.block(0, 1, 3, 1) = this->Mean[1];
    observation.block(0, 2, 3, 1) = vb;
    try
    {
        Matrix3d Cnb = reference.transpose().inverse() * observation.transpose();
        this->Cbn = Cnb;
        for(int i = 0; i < 30; ++i)
        {
            auto temp = (this->Cbn + (Cbn.transpose()).inverse()) * 0.5;
            this->Cbn = temp;
        }

        this->CalculateEuler(Cbn, this->Euler_mean);
    }
    catch(const std::exception& e)
    {
        std::cout << e.what() << '\n';
        return false;
    }

    return true;
}